

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fMultisampleTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::MultisampleCase::readImage(MultisampleCase *this,Surface *dst)

{
  int iVar1;
  int iVar2;
  GLenum GVar3;
  deBool dVar4;
  RenderContext *pRVar5;
  PixelBufferAccess local_68;
  PixelBufferAccess local_40;
  Surface *local_18;
  Surface *dst_local;
  MultisampleCase *this_local;
  
  local_18 = dst;
  dst_local = (Surface *)this;
  if (((this->m_fboParams).useFbo & 1U) == 0) {
    pRVar5 = Context::getRenderContext((this->super_TestCase).m_context);
    iVar1 = this->m_viewportX;
    iVar2 = this->m_viewportY;
    tcu::Surface::getAccess(&local_68,local_18);
    glu::readPixels(pRVar5,iVar1,iVar2,&local_68);
  }
  else {
    do {
      glwBindFramebuffer(0x8ca9,this->m_resolveFbo);
      GVar3 = glwGetError();
      glu::checkError(GVar3,"glBindFramebuffer(GL_DRAW_FRAMEBUFFER, m_resolveFbo)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fMultisampleTests.cpp"
                      ,0x196);
      dVar4 = ::deGetFalse();
    } while (dVar4 != 0);
    do {
      glwBlitFramebuffer(0,0,this->m_renderWidth,this->m_renderHeight,0,0,this->m_renderWidth,
                         this->m_renderHeight,0x4000,0x2600);
      GVar3 = glwGetError();
      glu::checkError(GVar3,
                      "glBlitFramebuffer(0, 0, m_renderWidth, m_renderHeight, 0, 0, m_renderWidth, m_renderHeight, GL_COLOR_BUFFER_BIT, GL_NEAREST)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fMultisampleTests.cpp"
                      ,0x197);
      dVar4 = ::deGetFalse();
    } while (dVar4 != 0);
    do {
      glwBindFramebuffer(0x8ca8,this->m_resolveFbo);
      GVar3 = glwGetError();
      glu::checkError(GVar3,"glBindFramebuffer(GL_READ_FRAMEBUFFER, m_resolveFbo)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fMultisampleTests.cpp"
                      ,0x198);
      dVar4 = ::deGetFalse();
    } while (dVar4 != 0);
    pRVar5 = Context::getRenderContext((this->super_TestCase).m_context);
    iVar1 = this->m_viewportX;
    iVar2 = this->m_viewportY;
    tcu::Surface::getAccess(&local_40,local_18);
    glu::readPixels(pRVar5,iVar1,iVar2,&local_40);
    do {
      glwBindFramebuffer(0x8d40,this->m_msFbo);
      GVar3 = glwGetError();
      glu::checkError(GVar3,"glBindFramebuffer(GL_FRAMEBUFFER, m_msFbo)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fMultisampleTests.cpp"
                      ,0x19c);
      dVar4 = ::deGetFalse();
    } while (dVar4 != 0);
  }
  return;
}

Assistant:

void MultisampleCase::readImage (tcu::Surface& dst) const
{
	if (m_fboParams.useFbo)
	{
		GLU_CHECK_CALL(glBindFramebuffer(GL_DRAW_FRAMEBUFFER, m_resolveFbo));
		GLU_CHECK_CALL(glBlitFramebuffer(0, 0, m_renderWidth, m_renderHeight, 0, 0, m_renderWidth, m_renderHeight, GL_COLOR_BUFFER_BIT, GL_NEAREST));
		GLU_CHECK_CALL(glBindFramebuffer(GL_READ_FRAMEBUFFER, m_resolveFbo));

		glu::readPixels(m_context.getRenderContext(), m_viewportX, m_viewportY, dst.getAccess());

		GLU_CHECK_CALL(glBindFramebuffer(GL_FRAMEBUFFER, m_msFbo));
	}
	else
		glu::readPixels(m_context.getRenderContext(), m_viewportX, m_viewportY, dst.getAccess());
}